

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

bool __thiscall dxil_spv::Converter::shader_requires_feature(Converter *this,ShaderFeature feature)

{
  Builder *pBVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  bool bVar5;
  
  if (feature == Native16BitOperations) {
    pBVar1 = SPIRVModule::get_builder
                       (((this->impl)._M_t.
                         super___uniq_ptr_impl<dxil_spv::Converter::Impl,_std::default_delete<dxil_spv::Converter::Impl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_dxil_spv::Converter::Impl_*,_std::default_delete<dxil_spv::Converter::Impl>_>
                         .super__Head_base<0UL,_dxil_spv::Converter::Impl_*,_false>._M_head_impl)->
                        spirv_module);
    p_Var2 = &(pBVar1->capabilities)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = (pBVar1->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var3 = &p_Var2->_M_header;
    for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < 9]) {
      if (8 < (int)p_Var4[1]._M_color) {
        p_Var3 = p_Var4;
      }
    }
    p_Var4 = &p_Var2->_M_header;
    if (((_Rb_tree_header *)p_Var3 != p_Var2) && (p_Var4 = p_Var3, 9 < (int)p_Var3[1]._M_color)) {
      p_Var4 = &p_Var2->_M_header;
    }
    bVar5 = true;
    if ((_Rb_tree_header *)p_Var4 == p_Var2) {
      pBVar1 = SPIRVModule::get_builder
                         (((this->impl)._M_t.
                           super___uniq_ptr_impl<dxil_spv::Converter::Impl,_std::default_delete<dxil_spv::Converter::Impl>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_dxil_spv::Converter::Impl_*,_std::default_delete<dxil_spv::Converter::Impl>_>
                           .super__Head_base<0UL,_dxil_spv::Converter::Impl_*,_false>._M_head_impl)
                          ->spirv_module);
      p_Var2 = &(pBVar1->capabilities)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (pBVar1->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var3 = &p_Var2->_M_header;
      for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < 0x16])
      {
        if (0x15 < (int)p_Var4[1]._M_color) {
          p_Var3 = p_Var4;
        }
      }
      p_Var4 = &p_Var2->_M_header;
      if (((_Rb_tree_header *)p_Var3 != p_Var2) && (p_Var4 = p_Var3, 0x16 < (int)p_Var3[1]._M_color)
         ) {
        p_Var4 = &p_Var2->_M_header;
      }
      bVar5 = (_Rb_tree_header *)p_Var4 != p_Var2;
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool Converter::shader_requires_feature(ShaderFeature feature) const
{
	switch (feature)
	{
	case ShaderFeature::Native16BitOperations:
		return impl->builder().hasCapability(spv::CapabilityFloat16) ||
		       impl->builder().hasCapability(spv::CapabilityInt16);

	default:
		return false;
	}
}